

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall
kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper(BufferedOutputStreamWrapper *this)

{
  uchar *puVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  bool bVar4;
  Runnable local_20;
  BufferedOutputStreamWrapper *local_18;
  
  (this->super_BufferedOutputStream).super_OutputStream._vptr_OutputStream =
       (_func_int **)&PTR__BufferedOutputStreamWrapper_001c26f0;
  bVar4 = UnwindDetector::isUnwinding(&this->unwindDetector);
  if (bVar4) {
    local_20._vptr_Runnable = (_func_int **)&PTR_run_001c29f8;
    local_18 = this;
    UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
  }
  else if ((this->buffer).ptr < this->bufferPos) {
    (*this->inner->_vptr_OutputStream[2])();
    this->bufferPos = (this->buffer).ptr;
  }
  puVar1 = (this->ownedBuffer).ptr;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = (this->ownedBuffer).size_;
    (this->ownedBuffer).ptr = (uchar *)0x0;
    (this->ownedBuffer).size_ = 0;
    pAVar3 = (this->ownedBuffer).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,puVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper() noexcept(false) {
  unwindDetector.catchExceptionsIfUnwinding([&]() {
    flush();
  });
}